

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

double __thiscall
soplex::SSVectorBase<double>::operator*(SSVectorBase<double> *this,SSVectorBase<double> *w)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar10;
  int iVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  ulong uVar5;
  ulong uVar9;
  
  setup(this);
  iVar6 = (this->super_IdxSet).num;
  iVar11 = (w->super_IdxSet).num;
  dVar12 = 0.0;
  dVar13 = 0.0;
  dVar14 = dVar12;
  if (0 < iVar11 && 0 < iVar6) {
    uVar3 = iVar11 - 1;
    uVar5 = (ulong)uVar3;
    uVar7 = iVar6 - 1;
    uVar9 = (ulong)uVar7;
    piVar1 = (this->super_IdxSet).idx;
    iVar6 = piVar1[uVar9];
    piVar2 = (w->super_IdxSet).idx;
    iVar11 = piVar2[uVar5];
    if (uVar3 != 0 && uVar7 != 0) {
      do {
        iVar8 = (int)uVar9;
        iVar4 = (int)uVar5;
        if (iVar6 == iVar11) {
          dVar14 = (this->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar11] *
                   (w->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar11];
          dVar15 = dVar12 + dVar14;
          dVar13 = dVar13 + (dVar14 - (dVar15 - dVar12)) + (dVar12 - (dVar15 - (dVar15 - dVar12)));
          uVar9 = (ulong)(iVar8 - 1);
          iVar6 = piVar1[(long)iVar8 + -1];
          uVar5 = (ulong)(iVar4 - 1);
          iVar11 = piVar2[(long)iVar4 + -1];
          dVar12 = dVar15;
        }
        else if (iVar11 < iVar6) {
          uVar9 = (ulong)(iVar8 - 1);
          iVar6 = piVar1[(long)iVar8 + -1];
        }
        else {
          uVar5 = (ulong)(iVar4 - 1);
          iVar11 = piVar2[(long)iVar4 + -1];
        }
        uVar3 = (uint)uVar5;
        uVar7 = (uint)uVar9;
      } while ((uVar7 != 0) && (uVar3 != 0));
    }
    if ((uVar7 != 0) && (iVar6 != iVar11)) {
      lVar10 = (long)(int)uVar7;
      do {
        lVar10 = lVar10 + -1;
        iVar6 = piVar1[lVar10];
        if (lVar10 == 0) break;
      } while (iVar6 != iVar11);
    }
    if ((uVar3 != 0) && (iVar6 != iVar11)) {
      lVar10 = (long)(int)uVar3;
      do {
        lVar10 = lVar10 + -1;
        iVar11 = piVar2[lVar10];
        if (lVar10 == 0) break;
      } while (iVar6 != iVar11);
    }
    dVar14 = dVar12;
    if (iVar6 == iVar11) {
      dVar15 = (this->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar6] *
               (w->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar6];
      dVar14 = dVar12 + dVar15;
      dVar13 = dVar13 + (dVar15 - (dVar14 - dVar12)) + (dVar12 - (dVar14 - (dVar14 - dVar12)));
    }
  }
  return dVar14 + dVar13;
}

Assistant:

R operator*(const SSVectorBase<S>& w)
   {
      setup();

      StableSum<R> x;
      int i = size() - 1;
      int j = w.size() - 1;

      // both *this and w non-zero vectors?
      if(i >= 0 && j >= 0)
      {
         int vi = index(i);
         int wj = w.index(j);

         while(i != 0 && j != 0)
         {
            if(vi == wj)
            {
               x += VectorBase<R>::val[vi] * R(w.val[wj]);
               vi = index(--i);
               wj = w.index(--j);
            }
            else if(vi > wj)
               vi = index(--i);
            else
               wj = w.index(--j);
         }

         /* check remaining indices */

         while(i != 0 && vi != wj)
            vi = index(--i);

         while(j != 0 && vi != wj)
            wj = w.index(--j);

         if(vi == wj)
            x += VectorBase<R>::val[vi] * R(w.val[wj]);
      }

      return x;
   }